

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O2

void __thiscall bsplib::Rdma::ActionBuf::~ActionBuf(ActionBuf *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_get_buffer_offset).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::~_Vector_base
            ((_Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_> *)this);
  return;
}

Assistant:

ActionBuf( int nprocs )
            : m_actions()
            , m_counts( nprocs )
            , m_get_buffer_offset( nprocs )
        {}